

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

void __thiscall
booster::locale::basic_message<wchar_t>::basic_message
          (basic_message<wchar_t> *this,string_type *context,string_type *single,string_type *plural
          ,int number)

{
  this->n_ = number;
  this->c_id_ = (char_type_conflict *)0x0;
  this->c_context_ = (char_type_conflict *)0x0;
  this->c_plural_ = (char_type_conflict *)0x0;
  std::__cxx11::wstring::wstring((wstring *)&this->id_,(wstring *)single);
  std::__cxx11::wstring::wstring((wstring *)&this->context_,(wstring *)context);
  std::__cxx11::wstring::wstring((wstring *)&this->plural_,(wstring *)plural);
  return;
}

Assistant:

explicit basic_message(string_type const &context,string_type const &single,string_type const &plural,int number) :
                n_(number),
                c_id_(0),
                c_context_(0),
                c_plural_(0),
                id_(single),
                context_(context),
                plural_(plural)
            {
            }